

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

PC * __thiscall
Hpipe::Context::keep_only(PC *__return_storage_ptr__,Context *this,Vec<unsigned_int> *keep)

{
  uint index;
  Context *this_00;
  bool bVar1;
  reference puVar2;
  CharItem **ppCVar3;
  const_iterator cStack_c8;
  uint ind;
  const_iterator __end1;
  const_iterator __begin1;
  Vec<unsigned_int> *__range1;
  PcMaker pm;
  Vec<unsigned_int> *keep_local;
  Context *this_local;
  
  pm.orig = (Context *)keep;
  anon_unknown_7::PcMaker::PcMaker((PcMaker *)&__range1,this);
  this_00 = pm.orig;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pm.orig);
  cStack_c8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff38);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    index = *puVar2;
    ppCVar3 = Vec<const_Hpipe::CharItem_*>::operator[](&this->pos,index);
    anon_unknown_7::PcMaker::add((PcMaker *)&__range1,*ppCVar3,index,true);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)&__range1);
  anon_unknown_7::PcMaker::~PcMaker((PcMaker *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::keep_only( const Vec<unsigned> &keep ) const {
    PcMaker pm( this );

    for( unsigned ind : keep )
        pm.add( pos[ ind ], ind );

    return pm.out();
}